

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ReLiveCUI::drawMenu(ReLiveCUI *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_10c;
  undefined1 local_108 [4];
  int right;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  reference local_88;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  undefined1 local_58 [8];
  string space;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *m;
  const_iterator __end2;
  const_iterator __begin2;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  int size;
  int pos;
  ReLiveCUI *this_local;
  
  bVar1 = validTerminal(this);
  if (bVar1) {
    __range2._4_4_ = 0;
    __range2._0_4_ = 1;
    __end2 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&g_fmenu_abi_cxx11_);
    m = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&g_fmenu_abi_cxx11_);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&m), bVar1) {
      space.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&__end2);
      iVar2 = std::__cxx11::string::size();
      __range2._0_4_ = (int)__range2 + iVar2 + 4;
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::string((string *)local_58);
    iVar2 = ghc::cui::window_base::width((window_base *)this);
    if ((int)__range2 <= iVar2) {
      std::__cxx11::string::operator=((string *)local_58,anon_var_dwarf_389f0 + 0x38fc);
    }
    __end2_1 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&g_fmenu_abi_cxx11_);
    m_1 = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&g_fmenu_abi_cxx11_);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&m_1), bVar1) {
      local_88 = std::
                 _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end2_1);
      if (local_88->first == 10) {
        iVar2 = ghc::cui::window_base::width((window_base *)this);
        iVar3 = std::__cxx11::string::size();
        iVar4 = std::__cxx11::string::size();
        iVar2 = (iVar2 - iVar3) + iVar4 * -2 + -3;
        local_10c = iVar2;
        iVar3 = ghc::cui::window_base::height((window_base *)this);
        std::__cxx11::to_string(&local_150,local_88->first);
        std::operator+(&local_130,"F",&local_150);
        ghc::cui::window_base::print((window_base *)this,iVar2,iVar3 + -1,&local_130,0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        iVar2 = local_10c + 3;
        iVar3 = ghc::cui::window_base::height((window_base *)this);
        std::operator+(&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,&local_88->second);
        std::operator+(&local_170,&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        ghc::cui::window_base::print((window_base *)this,iVar2,iVar3 + -1,&local_170,0x40000);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
      }
      else {
        iVar2 = ghc::cui::window_base::height((window_base *)this);
        std::__cxx11::to_string(&local_c8,local_88->first);
        std::operator+(&local_a8,"F",&local_c8);
        ghc::cui::window_base::print((window_base *)this,__range2._4_4_,iVar2 + -1,&local_a8,0);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        iVar2 = ghc::cui::window_base::height((window_base *)this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,&local_88->second);
        std::operator+(&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        ghc::cui::window_base::print
                  ((window_base *)this,__range2._4_4_ + 2,iVar2 + -1,&local_e8,0x40000);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)local_108);
        iVar2 = std::__cxx11::string::size();
        iVar3 = std::__cxx11::string::size();
        __range2._4_4_ = __range2._4_4_ + iVar2 + 2 + iVar3 * 2;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2_1);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void drawMenu()
    {
        if(validTerminal()) {
            int pos = 0;
            int size = 1; // for additional digit in F10
            for(const auto& m : g_fmenu) {
                size += 4 + m.second.size();
            }
            std::string space;
            if(size <= width()) {
                space = " ";
            }
            for(const auto& m : g_fmenu) {
                if(m.first != 10) {
                    print(pos, height() - 1, "F" + std::to_string(m.first));
                    print(pos+2, height() - 1, space + m.second + space, A_REVERSE);
                    pos += 2 + m.second.size() + space.size()*2;
                }
                else {
                    int right = width() - 3 - m.second.size() - space.size()*2;
                    print(right, height() - 1, "F" + std::to_string(m.first));
                    print(right+3, height() - 1, space + m.second + space, A_REVERSE);
                }
            }
        }
    }